

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O1

void deqp::gles2::Functional::eval_distance_vec2(ShaderEvalContext *c)

{
  ulong uVar1;
  int i;
  long lVar2;
  float sqSum;
  float fVar3;
  Vector<float,_2> res;
  float local_20 [4];
  ulong local_10;
  
  local_20[2] = c->in[0].m_data[3];
  local_20[3] = c->in[0].m_data[1];
  uVar1 = *(ulong *)c->in[1].m_data;
  local_10 = uVar1 << 0x20 | uVar1 >> 0x20;
  local_20[0] = 0.0;
  local_20[1] = 0.0;
  lVar2 = 0;
  do {
    local_20[lVar2] = local_20[lVar2 + 2] - *(float *)((long)&local_10 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  fVar3 = 0.0;
  lVar2 = 0;
  do {
    fVar3 = fVar3 + local_20[lVar2] * local_20[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  (c->color).m_data[0] = fVar3;
  return;
}

Assistant:

void eval_cross_vec3 (ShaderEvalContext& c) { c.color.xyz()	= cross(c.in[0].swizzle(2, 0, 1), c.in[1].swizzle(1, 2, 0)); }